

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvccapture2.cpp
# Opt level: O1

bool __thiscall V4L2Device::init_buffers(V4L2Device *this)

{
  int iVar1;
  void *pvVar2;
  Writer *pWVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  size_t *psVar8;
  undefined1 *puVar9;
  bool bVar10;
  v4l2_buffer bufferinfo;
  v4l2_requestbuffers bufrequest;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  Writer local_b8;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  uStack_3c = 0;
  local_38 = 0;
  uStack_44 = 1;
  uStack_40 = 1;
  local_48 = 0x20;
  iVar1 = ioctl(this->fd,0xc0145608);
  if (iVar1 < 0) {
    local_b8._vptr_Writer = (_func_int **)&PTR__Writer_00164080;
    local_b8.m_level = Error;
    local_b8.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
    ;
    local_b8.m_line = 0x165;
    local_b8.m_func = "bool V4L2Device::init_buffers()";
    local_b8.m_verboseLevel = 0;
    local_b8.m_logger = (Logger *)0x0;
    local_b8.m_proceed = false;
    local_b8.m_messageBuilder.m_logger = (Logger *)0x0;
    local_b8.m_messageBuilder.m_containerLogSeperator = "";
    local_b8.m_dispatchAction = NormalLog;
    local_b8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar3 = el::base::Writer::construct(&local_b8,1,"default");
    if ((pWVar3->m_proceed == true) &&
       (std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50,
                   "VIDIOC_REQBUFS failed: ",0x17),
       (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    if (pWVar3->m_proceed == true) {
      puVar9 = &((pWVar3->m_messageBuilder).m_logger)->field_0x50;
      if (pcVar5 == (char *)0x0) {
        std::ios::clear((int)puVar9 + (int)*(undefined8 *)(*(long *)puVar9 + -0x18));
      }
      else {
        sVar6 = strlen(pcVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar9,pcVar5,sVar6);
      }
      if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50," ",1);
      }
    }
    el::base::Writer::~Writer(&local_b8);
    bVar10 = false;
  }
  else {
    psVar8 = &(this->buffers)._M_elems[0].size;
    bVar10 = false;
    uVar7 = 0;
    do {
      uStack_110 = 0;
      local_e8 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_c8 = 0;
      uStack_e0 = 0x100000000;
      _local_118 = CONCAT44(1,(int)uVar7);
      iVar1 = ioctl(this->fd,0xc0585609,&local_118);
      if (iVar1 < 0) {
        local_b8._vptr_Writer = (_func_int **)&PTR__Writer_00164080;
        local_b8.m_level = Error;
        local_b8.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
        ;
        local_b8.m_line = 0x173;
        local_b8.m_func = "bool V4L2Device::init_buffers()";
        local_b8.m_verboseLevel = 0;
        local_b8.m_logger = (Logger *)0x0;
        local_b8.m_proceed = false;
        local_b8.m_messageBuilder.m_logger = (Logger *)0x0;
        local_b8.m_messageBuilder.m_containerLogSeperator = "";
        local_b8.m_dispatchAction = NormalLog;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar3 = el::base::Writer::construct(&local_b8,1,"default");
        if ((pWVar3->m_proceed == true) &&
           (std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50,
                       "VIDIOC_QUERYBUF failed: ",0x18),
           (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        if (pWVar3->m_proceed == true) {
          puVar9 = &((pWVar3->m_messageBuilder).m_logger)->field_0x50;
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)puVar9 + (int)*(undefined8 *)(*(long *)puVar9 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar9,pcVar5,sVar6);
          }
          if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50," ",1);
          }
        }
LAB_00143106:
        el::base::Writer::~Writer(&local_b8);
        return bVar10;
      }
      pvVar2 = mmap((void *)0x0,uStack_d0 & 0xffffffff,3,1,this->fd,local_d8 & 0xffffffff);
      ((IOBuffer *)(psVar8 + -1))->start = pvVar2;
      if (pvVar2 == (void *)0xffffffffffffffff) {
        local_b8._vptr_Writer = (_func_int **)&PTR__Writer_00164080;
        local_b8.m_level = Error;
        local_b8.m_file =
             "/workspace/llm4binary/github/license_all_cmakelists_25/thekvs[P]uvccapture2/src/uvccapture2.cpp"
        ;
        local_b8.m_line = 0x179;
        local_b8.m_func = "bool V4L2Device::init_buffers()";
        local_b8.m_verboseLevel = 0;
        local_b8.m_logger = (Logger *)0x0;
        local_b8.m_proceed = false;
        local_b8.m_messageBuilder.m_logger = (Logger *)0x0;
        local_b8.m_messageBuilder.m_containerLogSeperator = "";
        local_b8.m_dispatchAction = NormalLog;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_b8.m_loggerIds.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pWVar3 = el::base::Writer::construct(&local_b8,1,"default");
        if ((pWVar3->m_proceed == true) &&
           (std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50,
                       "mmaping buffer failed: ",0x17),
           (*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50," ",1);
        }
        piVar4 = __errno_location();
        pcVar5 = strerror(*piVar4);
        if (pWVar3->m_proceed == true) {
          puVar9 = &((pWVar3->m_messageBuilder).m_logger)->field_0x50;
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)puVar9 + (int)*(undefined8 *)(*(long *)puVar9 + -0x18));
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar9,pcVar5,sVar6);
          }
          if ((*(byte *)(el::base::elStorage + 0x21) & 0x20) != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&((pWVar3->m_messageBuilder).m_logger)->field_0x50," ",1);
          }
        }
        goto LAB_00143106;
      }
      *psVar8 = uStack_d0 & 0xffffffff;
      bVar10 = 0x1e < uVar7;
      uVar7 = uVar7 + 1;
      psVar8 = psVar8 + 2;
    } while (uVar7 != 0x20);
  }
  return bVar10;
}

Assistant:

bool
    init_buffers()
    {
        struct v4l2_requestbuffers bufrequest;
        std::memset(&bufrequest, 0, sizeof(bufrequest));

        bufrequest.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
        bufrequest.memory = V4L2_MEMORY_MMAP;
        bufrequest.count = kBuffersCount;

        if (ioctl(fd, VIDIOC_REQBUFS, &bufrequest) < 0) {
            LOG(ERROR) << "VIDIOC_REQBUFS failed: " << strerror(errno);
            return false;
        }

        struct v4l2_buffer bufferinfo;

        for (int i = 0; i < kBuffersCount; i++) {
            std::memset(&bufferinfo, 0, sizeof(bufferinfo));

            bufferinfo.type = V4L2_BUF_TYPE_VIDEO_CAPTURE;
            bufferinfo.memory = V4L2_MEMORY_MMAP;
            bufferinfo.index = i;

            if (ioctl(fd, VIDIOC_QUERYBUF, &bufferinfo) < 0) {
                LOG(ERROR) << "VIDIOC_QUERYBUF failed: " << strerror(errno);
                return false;
            }

            buffers[i].start = mmap(NULL, bufferinfo.length, PROT_READ | PROT_WRITE, MAP_SHARED, fd, bufferinfo.m.offset);
            if (buffers[i].start == MAP_FAILED) {
                LOG(ERROR) << "mmaping buffer failed: " << strerror(errno);
                return false;
            }

            buffers[i].size = bufferinfo.length;
        }

        return true;
    }